

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

string * __thiscall
cfd::core::DescriptorKeyInfo::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DescriptorKeyInfo *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  allocator *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  string *__return_storage_ptr___00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  allocator local_109;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_38;
  DescriptorKeyInfo *local_18;
  DescriptorKeyInfo *this_local;
  
  local_18 = this;
  this_local = (DescriptorKeyInfo *)__return_storage_ptr__;
  if (this->key_type_ == kDescriptorKeyPublic) {
    bVar1 = Privkey::IsValid(&this->privkey_);
    if (bVar1) {
      ::std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    }
    else {
      Pubkey::GetHex_abi_cxx11_(&local_38,&this->pubkey_);
      ::std::operator+(__return_storage_ptr__,&this->parent_info_,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
  }
  else if (this->key_type_ == kDescriptorKeyBip32) {
    pbVar3 = &this->parent_info_;
    ExtPubkey::ToString_abi_cxx11_(&local_88,&this->extpubkey_);
    ::std::operator+(&local_68,pbVar3,&local_88);
    ::std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_88);
  }
  else if (this->key_type_ == kDescriptorKeyBip32Priv) {
    __return_storage_ptr___00 = &local_c8;
    ExtPrivkey::ToString_abi_cxx11_(__return_storage_ptr___00,&this->extprivkey_);
    ::std::operator+(&local_a8,&this->parent_info_,__return_storage_ptr___00);
    ::std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_c8);
  }
  else if (this->key_type_ == kDescriptorKeySchnorr) {
    pbVar3 = &this->parent_info_;
    SchnorrPubkey::GetHex_abi_cxx11_(&local_108,&this->schnorr_pubkey_);
    ::std::operator+(&local_e8,pbVar3,&local_108);
    ::std::operator+(pbVar3,in_stack_fffffffffffffe90);
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_108);
  }
  else {
    paVar2 = &local_109;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",paVar2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorKeyInfo::ToString() const {
  if (key_type_ == DescriptorKeyType::kDescriptorKeyPublic) {
    if (privkey_.IsValid()) {
      return parent_info_ + key_string_;
    } else {
      return parent_info_ + pubkey_.GetHex();
    }
  } else if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32) {
    return parent_info_ + extpubkey_.ToString() + path_;
  } else if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
    return parent_info_ + extprivkey_.ToString() + path_;
  } else if (key_type_ == DescriptorKeyType::kDescriptorKeySchnorr) {
    return parent_info_ + schnorr_pubkey_.GetHex() + path_;
  } else {
    return "";
  }
}